

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::IsConfigurable
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArrayObject *pAVar4;
  uint uVar5;
  DictionaryPropertyDescriptor<unsigned_short> *local_38;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  PropertyRecord *propertyRecord;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x4e2,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) goto LAB_00c240a2;
    *puVar3 = 0;
  }
  descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar2 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,&local_38);
  if (bVar2) {
    if (((local_38->Attributes & 0x10) == 0) || ((local_38->flags & IsShadowed) != None)) {
      uVar5 = local_38->Attributes & 2;
    }
    else {
      uVar5 = 1;
      if ((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
          TypeIds_GlobalObject) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x4e8,"(VarIs<RootObjectBase>(instance))",
                                    "object must be a global object if letconstglobal is set");
        if (!bVar2) {
LAB_00c240a2:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  else {
    uVar5 = 1;
    if (descriptor[2].flags == PreventFalseReference) {
      pAVar4 = DynamicObject::GetObjectArray(instance);
      if (pAVar4 != (ArrayObject *)0x0) {
        uVar5 = (*(pAVar4->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x31])
                          (pAVar4,(ulong)(uint)propertyId);
      }
    }
  }
  return uVar5;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::IsConfigurable(DynamicObject* instance, PropertyId propertyId)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (!descriptor->HasNonLetConstGlobal())
            {
                AssertMsg(VarIs<RootObjectBase>(instance), "object must be a global object if letconstglobal is set");
                return true;
            }
            return descriptor->Attributes & PropertyConfigurable;
        }

        // Check numeric propertyRecord only if objectArray available
        if (propertyRecord->IsNumeric())
        {
            ArrayObject * objectArray = instance->GetObjectArray();
            if (objectArray != nullptr)
            {
                return objectArray->IsConfigurable(propertyId);
            }
        }

        return true;
    }